

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_hash(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  uint uVar25;
  int test_ret;
  
  if (quiet == 0) {
    printf("Testing hash : 17 of 25 functions ...\n");
  }
  iVar1 = test_xmlHashAddEntry();
  iVar2 = test_xmlHashAddEntry2();
  iVar3 = test_xmlHashAddEntry3();
  iVar4 = test_xmlHashCopy();
  iVar5 = test_xmlHashCreate();
  iVar6 = test_xmlHashCreateDict();
  iVar7 = test_xmlHashDefaultDeallocator();
  iVar8 = test_xmlHashLookup();
  iVar9 = test_xmlHashLookup2();
  iVar10 = test_xmlHashLookup3();
  iVar11 = test_xmlHashQLookup();
  iVar12 = test_xmlHashQLookup2();
  iVar13 = test_xmlHashQLookup3();
  iVar14 = test_xmlHashRemoveEntry();
  iVar15 = test_xmlHashRemoveEntry2();
  iVar16 = test_xmlHashRemoveEntry3();
  iVar17 = test_xmlHashScan();
  iVar18 = test_xmlHashScan3();
  iVar19 = test_xmlHashScanFull();
  iVar20 = test_xmlHashScanFull3();
  iVar21 = test_xmlHashSize();
  iVar22 = test_xmlHashUpdateEntry();
  iVar23 = test_xmlHashUpdateEntry2();
  iVar24 = test_xmlHashUpdateEntry3();
  uVar25 = iVar24 + iVar23 + iVar22 + iVar21 + iVar20 + iVar19 + iVar18 + iVar17 + iVar16 + iVar15 +
                                                                                            iVar14 +
                                                                                            iVar13 +
                                                                                            iVar12 +
                                                                                            iVar11 +
                                                                                            iVar10 +
                                                                                            iVar9 + 
                                                  iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + 
                                                  iVar2 + iVar1;
  if (uVar25 != 0) {
    printf("Module hash: %d errors\n",(ulong)uVar25);
  }
  return uVar25;
}

Assistant:

static int
test_hash(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing hash : 17 of 25 functions ...\n");
    test_ret += test_xmlHashAddEntry();
    test_ret += test_xmlHashAddEntry2();
    test_ret += test_xmlHashAddEntry3();
    test_ret += test_xmlHashCopy();
    test_ret += test_xmlHashCreate();
    test_ret += test_xmlHashCreateDict();
    test_ret += test_xmlHashDefaultDeallocator();
    test_ret += test_xmlHashLookup();
    test_ret += test_xmlHashLookup2();
    test_ret += test_xmlHashLookup3();
    test_ret += test_xmlHashQLookup();
    test_ret += test_xmlHashQLookup2();
    test_ret += test_xmlHashQLookup3();
    test_ret += test_xmlHashRemoveEntry();
    test_ret += test_xmlHashRemoveEntry2();
    test_ret += test_xmlHashRemoveEntry3();
    test_ret += test_xmlHashScan();
    test_ret += test_xmlHashScan3();
    test_ret += test_xmlHashScanFull();
    test_ret += test_xmlHashScanFull3();
    test_ret += test_xmlHashSize();
    test_ret += test_xmlHashUpdateEntry();
    test_ret += test_xmlHashUpdateEntry2();
    test_ret += test_xmlHashUpdateEntry3();

    if (test_ret != 0)
	printf("Module hash: %d errors\n", test_ret);
    return(test_ret);
}